

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

void pstore::command_line::
     apply_to_option<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,char_const(&)[4],pstore::command_line::details::positional_const&>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *opt,char (*m0) [4],positional *mods)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,*m0,&local_51);
  name::name((name *)&local_50,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  option::set_name(&opt->super_option,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  option::set_positional(&opt->super_option);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }